

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_len(char *s,ssize_t i,ssize_t j)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar4 = 0;
  }
  else {
    if (i < 0) {
      lVar3 = sVar1 - 1;
      if ((long)(i + sVar1) < (long)sVar1) {
        lVar3 = i + sVar1;
      }
    }
    else {
      lVar3 = sVar1 - 1;
      if (i < (long)sVar1) {
        lVar3 = i;
      }
    }
    if (j < 0) {
      lVar4 = sVar1 - 1;
      if ((long)(j + sVar1) < (long)sVar1) {
        lVar4 = j + sVar1;
      }
    }
    else {
      lVar4 = sVar1 - 1;
      if (j < (long)sVar1) {
        lVar4 = j;
      }
    }
    lVar2 = lVar4;
    if (lVar4 < lVar3) {
      lVar2 = lVar3;
    }
    if (lVar3 < lVar4) {
      lVar4 = lVar3;
    }
    lVar4 = lVar4 - lVar2;
  }
  lVar3 = -lVar4;
  if (0 < lVar4) {
    lVar3 = lVar4;
  }
  return lVar3 + 1;
}

Assistant:

size_t
zt_cstr_len(const char *s, ssize_t i, ssize_t j) {
    CONVERT(s, i, j);
    return IDXLEN(i, j);
}